

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::Set
          (RepeatedField<unsigned_int> *this,int index,uint *value)

{
  uint uVar1;
  LogMessage *pLVar2;
  uint *puVar3;
  LogMessage local_a8;
  LogMessage local_70;
  LogFinisher local_31;
  
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x52c);
    pLVar2 = internal::LogMessage::operator<<(&local_a8,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar2);
    internal::LogMessage::~LogMessage(&local_a8);
  }
  if (this->current_size_ <= index) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x52d);
    pLVar2 = internal::LogMessage::operator<<(&local_70,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_31,pLVar2);
    internal::LogMessage::~LogMessage(&local_70);
  }
  uVar1 = *value;
  puVar3 = elements(this);
  puVar3[index] = uVar1;
  return;
}

Assistant:

inline void RepeatedField<Element>::Set(int index, const Element& value) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  elements()[index] = value;
}